

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer> __thiscall
kj::_::PromiseDisposer::
alloc<kj::_::ArrayJoinPromiseNode<void>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
          (PromiseDisposer *this,Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *params
          ,Array<kj::_::ExceptionOr<kj::_::Void>_> *params_1,SourceLocation *params_2,
          ArrayJoinBehavior *params_3)

{
  void *pvVar1;
  
  pvVar1 = operator_new(0x400);
  ctor<kj::_::ArrayJoinPromiseNode<void>,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<kj::_::Void>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((ArrayJoinPromiseNode<void> *)((long)pvVar1 + 0x3a8),params,params_1,params_2,params_3)
  ;
  *(void **)((long)pvVar1 + 0x3b0) = pvVar1;
  *(ArrayJoinPromiseNode<void> **)this = (ArrayJoinPromiseNode<void> *)((long)pvVar1 + 0x3a8);
  return (Own<kj::_::ArrayJoinPromiseNode<void>,_kj::_::PromiseDisposer>)
         (ArrayJoinPromiseNode<void> *)this;
}

Assistant:

static kj::Own<T, D> alloc(Params&&... params) noexcept {
    // Implements allocPromise().
    T* ptr;
    if (!canArenaAllocate<T>()) {
      // Node too big (or needs weird alignment), fall back to regular heap allocation.
      ptr = new T(kj::fwd<Params>(params)...);
    } else {
      // Start a new arena.
      //
      // NOTE: As in appendPromise() (below), we don't implement exception-safety because it causes
      //   code bloat and these constructors probably don't throw. Instead this function is
      //   noexcept, so if a constructor does throw, it'll crash rather than leak memory.
      auto* arena = new PromiseArena;
      ptr = reinterpret_cast<T*>(arena + 1) - 1;
      ctor(*ptr, kj::fwd<Params>(params)...);
      ptr->arena = arena;
      KJ_IREQUIRE(reinterpret_cast<void*>(ptr) ==
                  reinterpret_cast<void*>(static_cast<PromiseArenaMember*>(ptr)),
          "PromiseArenaMember must be the leftmost inherited type.");
    }
    return kj::Own<T, D>(ptr);
  }